

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_CountdownArg
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  int iVar1;
  uint uVar2;
  MetaClass *pMVar3;
  VMValue *pVVar4;
  bool bVar5;
  bool local_6f;
  FName local_6c;
  TAngle<double> local_68;
  FName local_5c;
  TFlags<ActorFlag,_unsigned_int> local_58;
  TFlags<ActorFlag,_unsigned_int> local_54;
  FState *local_50;
  FState *state;
  AActor *pAStack_40;
  int cnt;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe75,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe75,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAStack_40 = *(AActor **)&param->field_0;
  local_6f = true;
  if (pAStack_40 != (AActor *)0x0) {
    local_6f = DObject::IsKindOf((DObject *)pAStack_40,AActor::RegistrationInfo.MyClass);
  }
  if (local_6f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe75,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  iVar1 = (int)self + 1;
  if (ret_local._4_4_ <= iVar1) {
    self._0_4_ = iVar1;
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe76,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((char)defaultparam_local[iVar1].Count != '\0') {
    self._0_4_ = iVar1;
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe76,
                  "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  state._4_4_ = *(int *)&defaultparam_local[iVar1].Array;
  self._0_4_ = (int)self + 2;
  if ((int)self < ret_local._4_4_) {
    if ((char)defaultparam_local[(int)self].Count != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe77,
                    "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = *(int *)&defaultparam_local[(int)self].Array;
    pMVar3 = AActor::GetClass(pAStack_40);
    local_50 = FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar3,false);
  }
  else {
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    if ((pVVar4->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe77,
                    "int AF_AActor_A_CountdownArg(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
    iVar1 = (pVVar4->field_0).i;
    pMVar3 = AActor::GetClass(pAStack_40);
    local_50 = FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar3,false);
  }
  if (((-1 < state._4_4_) && (state._4_4_ < 5)) &&
     (iVar1 = pAStack_40->args[state._4_4_], pAStack_40->args[state._4_4_] = iVar1 + -1, iVar1 == 0)
     ) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_54,
               (int)pAStack_40 +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
    if (uVar2 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_58,
                 (int)pAStack_40 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_58);
      this = pAStack_40;
      if (uVar2 == 0) {
        if (local_50 == (FState *)0x0) {
          FName::FName(&local_6c,NAME_Death);
          local_50 = AActor::FindState(this,&local_6c);
        }
        AActor::SetState(pAStack_40,local_50,false);
      }
      else {
        iVar1 = pAStack_40->health;
        FName::FName(&local_5c,NAME_None);
        TAngle<double>::TAngle(&local_68,0.0);
        P_DamageMobj(this,(AActor *)0x0,(AActor *)0x0,iVar1,&local_5c,8,&local_68);
      }
    }
    else {
      P_ExplodeMissile(pAStack_40,(line_t_conflict *)0x0,(AActor *)0x0);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CountdownArg)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(cnt);
	PARAM_STATE_DEF(state)

	if (cnt<0 || cnt >= 5) return 0;
	if (!self->args[cnt]--)
	{
		if (self->flags&MF_MISSILE)
		{
			P_ExplodeMissile(self, NULL, NULL);
		}
		else if (self->flags&MF_SHOOTABLE)
		{
			P_DamageMobj(self, NULL, NULL, self->health, NAME_None, DMG_FORCED);
		}
		else
		{
			if (state == nullptr) state = self->FindState(NAME_Death);
			self->SetState(state);
		}
	}
	return 0;
}